

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O0

size_t __thiscall camp::ArrayProperty::size(ArrayProperty *this,UserObject *object)

{
  bool bVar1;
  int iVar2;
  ForbiddenRead *__return_storage_ptr__;
  string *propertyName;
  undefined4 extraout_var;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  ForbiddenRead local_60;
  UserObject *local_18;
  UserObject *object_local;
  ArrayProperty *this_local;
  
  local_18 = object;
  object_local = (UserObject *)this;
  bVar1 = Property::readable(&this->super_Property,object);
  if (!bVar1) {
    __return_storage_ptr__ = (ForbiddenRead *)__cxa_allocate_exception(0x48);
    propertyName = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenRead::ForbiddenRead(&local_60,propertyName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"std::size_t camp::ArrayProperty::size(const UserObject &) const",&local_b9)
    ;
    Error::prepare<camp::ForbiddenRead>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x44,(string *)local_b8);
    __cxa_throw(__return_storage_ptr__,&ForbiddenRead::typeinfo,ForbiddenRead::~ForbiddenRead);
  }
  iVar2 = (*(this->super_Property).super_TagHolder._vptr_TagHolder[7])(this,local_18);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

std::size_t ArrayProperty::size(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getSize(object);
}